

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall CLIntercept::checkRemoveSemaphoreInfo(CLIntercept *this,cl_semaphore_khr semaphore)

{
  _Base_ptr platform;
  cl_int cVar1;
  iterator __position;
  CLdispatchX *pCVar2;
  allocator local_51;
  cl_semaphore_khr semaphore_local;
  cl_uint refCount;
  
  semaphore_local = semaphore;
  std::mutex::lock(&this->m_Mutex);
  __position = std::
               _Rb_tree<_cl_semaphore_khr_*,_std::pair<_cl_semaphore_khr_*const,__cl_platform_id_*>,_std::_Select1st<std::pair<_cl_semaphore_khr_*const,__cl_platform_id_*>_>,_std::less<_cl_semaphore_khr_*>,_std::allocator<std::pair<_cl_semaphore_khr_*const,__cl_platform_id_*>_>_>
               ::find(&(this->m_SemaphoreInfoMap)._M_t,&semaphore_local);
  if ((_Rb_tree_header *)__position._M_node !=
      &(this->m_SemaphoreInfoMap)._M_t._M_impl.super__Rb_tree_header) {
    platform = __position._M_node[1]._M_parent;
    pCVar2 = dispatchX(this,(cl_platform_id)platform);
    if (pCVar2->clGetSemaphoreInfoKHR ==
        (_func_cl_int_cl_semaphore_khr_cl_semaphore_info_khr_size_t_void_ptr_size_t_ptr *)0x0) {
      std::__cxx11::string::string((string *)&refCount,"clGetSemaphoreInfoKHR",&local_51);
      getExtensionFunctionAddress(this,(cl_platform_id)platform,(string *)&refCount);
      std::__cxx11::string::~string((string *)&refCount);
    }
    pCVar2 = dispatchX(this,(cl_platform_id)platform);
    if (pCVar2->clGetSemaphoreInfoKHR !=
        (_func_cl_int_cl_semaphore_khr_cl_semaphore_info_khr_size_t_void_ptr_size_t_ptr *)0x0) {
      refCount = 0;
      cVar1 = (*pCVar2->clGetSemaphoreInfoKHR)(semaphore_local,0x203a,4,&refCount,(size_t *)0x0);
      if ((cVar1 == 0) && (refCount == 1)) {
        std::
        _Rb_tree<_cl_semaphore_khr*,std::pair<_cl_semaphore_khr*const,_cl_platform_id*>,std::_Select1st<std::pair<_cl_semaphore_khr*const,_cl_platform_id*>>,std::less<_cl_semaphore_khr*>,std::allocator<std::pair<_cl_semaphore_khr*const,_cl_platform_id*>>>
        ::erase_abi_cxx11_((_Rb_tree<_cl_semaphore_khr*,std::pair<_cl_semaphore_khr*const,_cl_platform_id*>,std::_Select1st<std::pair<_cl_semaphore_khr*const,_cl_platform_id*>>,std::less<_cl_semaphore_khr*>,std::allocator<std::pair<_cl_semaphore_khr*const,_cl_platform_id*>>>
                            *)&this->m_SemaphoreInfoMap,__position);
      }
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return;
}

Assistant:

void CLIntercept::checkRemoveSemaphoreInfo(
    cl_semaphore_khr semaphore )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    CSemaphoreInfoMap::iterator iter = m_SemaphoreInfoMap.find( semaphore );
    if( iter != m_SemaphoreInfoMap.end() )
    {
        cl_platform_id  platform = iter->second;
        if( dispatchX(platform).clGetSemaphoreInfoKHR == NULL )
        {
            getExtensionFunctionAddress(
                platform,
                "clGetSemaphoreInfoKHR" );
        }

        const auto& dispatchX = this->dispatchX(platform);
        if( dispatchX.clGetSemaphoreInfoKHR )
        {
            cl_uint refCount = 0;
            cl_int  errorCode = CL_SUCCESS;
            errorCode = dispatchX.clGetSemaphoreInfoKHR(
                semaphore,
                CL_SEMAPHORE_REFERENCE_COUNT_KHR,
                sizeof( refCount ),
                &refCount,
                NULL );
            if( errorCode == CL_SUCCESS && refCount == 1 )
            {
                m_SemaphoreInfoMap.erase( iter );
            }
        }
    }
}